

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  char *pcVar1;
  ulong uVar2;
  ctrl_t *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  slot_type *ppDVar6;
  size_t sVar7;
  uint64_t uVar8;
  ulong uVar9;
  size_t hash;
  size_t hash_00;
  byte bVar10;
  uint64_t v;
  uint64_t v_1;
  ctrl_t cVar11;
  uchar *bytes;
  ulong uVar12;
  size_t sVar13;
  bool bVar14;
  FindInfo FVar15;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  size_t local_58;
  HeapOrSoo local_50;
  size_t local_40;
  byte local_38;
  char local_37;
  byte local_36;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
                 );
  }
  sVar13 = common->capacity_;
  if (sVar13 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
                 );
  }
  if (sVar13 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                *)common);
    bVar14 = 1 < common->size_;
  }
  else {
    bVar14 = false;
  }
  bVar10 = 0x80;
  if (bVar14 != false) {
    ppDVar6 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                        *)common);
    pcVar1 = (*ppDVar6)->filename;
    sVar7 = strlen(pcVar1);
    uVar8 = hash_internal::MixingHashState::CombineContiguousImpl
                      (&hash_internal::MixingHashState::kSeed,pcVar1,sVar7);
    bVar10 = (byte)((uVar8 ^ sVar7) * 0x5cb22ca68cb134ed >> 0x38) & 0x7f;
  }
  local_40 = common->capacity_;
  local_38 = (byte)common->size_ & 1;
  local_37 = sVar13 == 1;
  local_50.heap.control = (common->heap_or_soo_).heap.control;
  local_50.heap.slot_array =
       (MaybeInitializedPtr)((MaybeInitializedPtr *)((long)&common->heap_or_soo_ + 8))->p;
  local_36 = bVar14;
  CommonFields::set_capacity(common,new_capacity);
  bVar5 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,8ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_50,common,&local_59,(int)(char)bVar10,8,8);
  if (local_40 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, std::allocator<const google::protobuf::internal::DescriptorTable *>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::internal::DescriptorTable *>, Hash = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameHash, Eq = google::protobuf::(anonymous namespace)::GeneratedMessageFactory::DescriptorByNameEq, Alloc = std::allocator<const google::protobuf::internal::DescriptorTable *>]"
                 );
  }
  if ((bVar14 | sVar13 != 1) == 1) {
    local_58 = sVar13;
    ppDVar6 = slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::internal::DescriptorTable_*>,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameHash,_google::protobuf::(anonymous_namespace)::GeneratedMessageFactory::DescriptorByNameEq,_std::allocator<const_google::protobuf::internal::DescriptorTable_*>_>
                          *)common);
    uVar4 = local_50.heap.slot_array;
    sVar13 = local_58;
    if (!bVar5) {
      if (local_58 == 1) {
        pcVar1 = *(char **)(local_50.heap.control + 0x10);
        sVar7 = strlen(pcVar1);
        uVar8 = hash_internal::MixingHashState::CombineContiguousImpl
                          (&hash_internal::MixingHashState::kSeed,pcVar1,sVar7);
        uVar12 = (uVar8 ^ sVar7) * -0x234dd359734ecb13;
        FVar15 = find_first_non_full<void>
                           ((container_internal *)common,
                            (CommonFields *)
                            (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                             (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8 |
                             (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                             (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38),hash);
        uVar9 = FVar15.offset;
        uVar2 = common->capacity_;
        if (uVar2 <= uVar9) {
LAB_0024afd1:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar11 = (ctrl_t)(uVar12 >> 0x38) & ~kEmpty;
        pcVar3 = (common->heap_or_soo_).heap.control;
        pcVar3[uVar9] = cVar11;
        pcVar3[(ulong)((uint)uVar2 & 0xf) + (uVar9 - 0xf & uVar2)] = cVar11;
        common->capacity_ = 0xffffffffffffff9c;
        ppDVar6[uVar9] = (slot_type)local_50.heap.control;
        CommonFields::set_capacity(common,uVar2);
      }
      else {
        if (local_37 == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_40 != 0) {
          sVar13 = 0;
          do {
            if (local_37 == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_50.heap.control[sVar13]) {
              pcVar1 = *(char **)(*(long *)(uVar4 + sVar13 * 8) + 0x10);
              sVar7 = strlen(pcVar1);
              uVar8 = hash_internal::MixingHashState::CombineContiguousImpl
                                (&hash_internal::MixingHashState::kSeed,pcVar1,sVar7);
              uVar12 = (uVar8 ^ sVar7) * -0x234dd359734ecb13;
              FVar15 = find_first_non_full<void>
                                 ((container_internal *)common,
                                  (CommonFields *)
                                  (uVar12 >> 0x38 | (uVar12 & 0xff000000000000) >> 0x28 |
                                   (uVar12 & 0xff0000000000) >> 0x18 | (uVar12 & 0xff00000000) >> 8
                                   | (uVar12 & 0xff000000) << 8 | (uVar12 & 0xff0000) << 0x18 |
                                   (uVar12 & 0xff00) << 0x28 | uVar12 << 0x38),hash_00);
              uVar9 = FVar15.offset;
              uVar2 = common->capacity_;
              if (uVar2 <= uVar9) goto LAB_0024afd1;
              cVar11 = (ctrl_t)(uVar12 >> 0x38) & ~kEmpty;
              pcVar3 = (common->heap_or_soo_).heap.control;
              pcVar3[uVar9] = cVar11;
              pcVar3[(ulong)((uint)uVar2 & 0xf) + (uVar9 - 0xf & uVar2)] = cVar11;
              common->capacity_ = 0xffffffffffffff9c;
              ppDVar6[uVar9] = *(slot_type *)(uVar4 + sVar13 * 8);
              CommonFields::set_capacity(common,uVar2);
            }
            sVar13 = sVar13 + 1;
          } while (sVar13 != local_40);
        }
        sVar13 = local_58;
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
      }
      if (sVar13 != 1) {
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_50,&local_5a,8);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }